

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_sunmatrix_sparse.c
# Opt level: O0

int check_vector(N_Vector x,N_Vector y,realtype tol)

{
  realtype *prVar1;
  realtype *prVar2;
  long lVar3;
  long lVar4;
  uint local_5c;
  long local_58;
  sunindextype i;
  sunindextype yldata;
  sunindextype xldata;
  realtype *ydata;
  realtype *xdata;
  int failure;
  realtype tol_local;
  N_Vector y_local;
  N_Vector x_local;
  
  xdata._4_4_ = 0;
  prVar1 = N_VGetArrayPointer(x);
  prVar2 = N_VGetArrayPointer(y);
  lVar3 = N_VGetLength_Serial(x);
  lVar4 = N_VGetLength_Serial(y);
  if (lVar3 == lVar4) {
    for (local_58 = 0; local_58 < lVar3; local_58 = local_58 + 1) {
      if (NAN(prVar1[local_58])) {
        local_5c = 1;
      }
      else {
        local_5c = (uint)(tol < ABS(prVar1[local_58] - prVar2[local_58]) / ABS(prVar2[local_58]));
      }
      xdata._4_4_ = local_5c + xdata._4_4_;
    }
    if ((double)xdata._4_4_ <= 0.0) {
      x_local._4_4_ = 0;
    }
    else {
      x_local._4_4_ = 1;
    }
  }
  else {
    printf(">>> ERROR: check_vector: Different data array lengths \n");
    x_local._4_4_ = 1;
  }
  return x_local._4_4_;
}

Assistant:

int check_vector(N_Vector x, N_Vector y, realtype tol)
{
  int failure = 0;
  realtype *xdata, *ydata;
  sunindextype xldata, yldata;
  sunindextype i;

  /* get vector data */
  xdata = N_VGetArrayPointer(x);
  ydata = N_VGetArrayPointer(y);

  /* check data lengths */
  xldata = N_VGetLength_Serial(x);
  yldata = N_VGetLength_Serial(y);

  if (xldata != yldata) {
    printf(">>> ERROR: check_vector: Different data array lengths \n");
    return(1);
  }

  /* check vector data */
  for(i=0; i < xldata; i++){
    failure += FNEQ(xdata[i], ydata[i], tol);
  }

  if (failure > ZERO)
    return(1);
  else
    return(0);
}